

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  Extension *pEVar1;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar2;
  
  if (message == (MessageLite *)0x0) {
    pEVar1 = FindOrNull(this,number);
    if (pEVar1 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar1);
    return;
  }
  pVar2 = Insert(this,number);
  pEVar1 = pVar2.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if ((pEVar1->field_0xa & 0x10) != 0) {
      (*((pEVar1->field_0).message_value)->_vptr_MessageLite[6])
                ((pEVar1->field_0).message_value,message);
      goto LAB_001fda15;
    }
    if ((this->arena_ == (Arena *)0x0) && ((pEVar1->field_0).message_value != (MessageLite *)0x0)) {
      (*((pEVar1->field_0).message_value)->_vptr_MessageLite[1])();
    }
  }
  else {
    pEVar1->type = type;
    pEVar1->is_repeated = false;
    pEVar1->field_0xa = pEVar1->field_0xa & 0xf;
  }
  (pEVar1->field_0).message_value = message;
LAB_001fda15:
  pEVar1->field_0xa = pEVar1->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::UnsafeArenaSetAllocatedMessage(
    int number, FieldType type, const FieldDescriptor* descriptor,
    MessageLite* message) {
  if (message == NULL) {
    ClearExtension(number);
    return;
  }
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = message;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->UnsafeArenaSetAllocatedMessage(message);
    } else {
      if (arena_ == NULL) {
        delete extension->message_value;
      }
      extension->message_value = message;
    }
  }
  extension->is_cleared = false;
}